

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3DefaultRowEst(Index *pIdx)

{
  ushort uVar1;
  short sVar2;
  short *psVar3;
  ushort uVar4;
  ulong uVar5;
  ulong uVar6;
  
  psVar3 = pIdx->aiRowLogEst;
  uVar1 = pIdx->nKeyCol;
  uVar4 = 5;
  if (uVar1 < 5) {
    uVar4 = uVar1;
  }
  sVar2 = pIdx->pTable->nRowLogEst;
  *psVar3 = sVar2;
  if (pIdx->pPartIdxWhere != (Expr *)0x0) {
    *psVar3 = sVar2 + -10;
  }
  if (*psVar3 < 0x21) {
    *psVar3 = 0x21;
  }
  memcpy(psVar3 + 1,&DAT_0017f4c8,(ulong)(ushort)(uVar4 * 2));
  uVar5 = (ulong)pIdx->nKeyCol;
  if (uVar4 < pIdx->nKeyCol) {
    uVar4 = 5;
    if (uVar1 < 5) {
      uVar4 = uVar1;
    }
    uVar6 = (ulong)uVar4;
    do {
      psVar3[uVar6 + 1] = 0x17;
      uVar6 = uVar6 + 1;
      uVar5 = (ulong)pIdx->nKeyCol;
    } while (uVar6 < uVar5);
  }
  if (pIdx->onError != '\0') {
    psVar3[uVar5] = 0;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DefaultRowEst(Index *pIdx){
  /*                10,  9,  8,  7,  6 */
  LogEst aVal[] = { 33, 32, 30, 28, 26 };
  LogEst *a = pIdx->aiRowLogEst;
  int nCopy = MIN(ArraySize(aVal), pIdx->nKeyCol);
  int i;

  /* Set the first entry (number of rows in the index) to the estimated 
  ** number of rows in the table, or half the number of rows in the table
  ** for a partial index.   But do not let the estimate drop below 10. */
  a[0] = pIdx->pTable->nRowLogEst;
  if( pIdx->pPartIdxWhere!=0 ) a[0] -= 10;  assert( 10==sqlite3LogEst(2) );
  if( a[0]<33 ) a[0] = 33;                  assert( 33==sqlite3LogEst(10) );

  /* Estimate that a[1] is 10, a[2] is 9, a[3] is 8, a[4] is 7, a[5] is
  ** 6 and each subsequent value (if any) is 5.  */
  memcpy(&a[1], aVal, nCopy*sizeof(LogEst));
  for(i=nCopy+1; i<=pIdx->nKeyCol; i++){
    a[i] = 23;                    assert( 23==sqlite3LogEst(5) );
  }

  assert( 0==sqlite3LogEst(1) );
  if( IsUniqueIndex(pIdx) ) a[pIdx->nKeyCol] = 0;
}